

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getstr.c
# Opt level: O3

int getstring(char *prompt,char *buf,int bufl)

{
  int iVar1;
  int state;
  char *pcVar2;
  uchar *puVar3;
  byte bVar4;
  byte *pbVar5;
  
  state = setmore(0);
  if (prompt != (char *)0x0) {
    outformat(prompt);
    out_logfile_print(prompt,0);
  }
  outflushn(0);
  outreset();
  iVar1 = scrquiet;
  if (scrfp != (osfildef *)0x0) {
    pcVar2 = qasgets(buf,bufl);
    if (pcVar2 == (char *)0x0) {
      if ((prompt != (char *)0x0) && (iVar1 != 0)) {
        outformat(prompt);
      }
      outflushn(0);
      outreset();
      os_nonstop_mode(0);
      state = 1;
    }
    if (scrfp != (osfildef *)0x0) {
      setmore(state);
      goto LAB_00213b4f;
    }
  }
  runstat();
  puVar3 = os_gets((uchar *)buf,(long)bufl);
  setmore(state);
  if (puVar3 == (uchar *)0x0) {
    return 1;
  }
LAB_00213b4f:
  out_logfile_print(buf,1);
  if (cmdfile != (osfildef *)0x0) {
    os_fprintz(cmdfile,">");
    os_fprintz(cmdfile,buf);
    os_fprintz(cmdfile,"\n");
  }
  bVar4 = *buf;
  if (bVar4 != 0) {
    pbVar5 = (byte *)(buf + 1);
    do {
      pbVar5[-1] = G_cmap_input[bVar4];
      bVar4 = *pbVar5;
      pbVar5 = pbVar5 + 1;
    } while (bVar4 != 0);
  }
  return 0;
}

Assistant:

int getstring(char *prompt, char *buf, int bufl)
{
    char  *result;
    int    savemoremode;
    int    retval;

    /* show prompt if one was given and flush output */
    savemoremode = setmore(0);
    if (prompt != 0)
    {
        /* display the prompt text */
        outformat(prompt);

        /* make sure it shows up in the log file as well */
        out_logfile_print(prompt, FALSE);
    }
    outflushn(0);
    outreset();

    /* read from the command input file if we have one */
    if (scrfp != 0)
    {
        int quiet = scrquiet;
        
        /* try reading from command input file */
        if ((result = qasgets(buf, bufl)) == 0)
        {
            /*
             *   End of command input file; return to reading the
             *   keyboard.  If we didn't already show the prompt, show it
             *   now.
             *   
             *   Note that qasgets() will have closed the script file
             *   before returning eof, so we won't directly read the
             *   command here but instead handle it later when we check to
             *   see if we need to read from the keyboard.  
             */
            if (quiet && prompt != 0)
                outformat(prompt);
            outflushn(0);
            outreset();

            /*
             *   Guarantee that moremode is turned back on.  (moremode can
             *   be turned off for one of two reasons: we're printing the
             *   prompt, or we're reading from a script with no pauses.
             *   In either case, moremode should be turned back on at this
             *   point. -CDN) 
             */
            savemoremode = 1;

            /* turn off NONSTOP mode now that we're done with the script */
            os_nonstop_mode(FALSE);
        }

        /* success */
        retval = 0;
    }

    /* if we don't have a script file, read from the keyboard */
    if (scrfp == 0)
    {
        /* update the status line */
        runstat();
        
        /* read a line from the keyboard */
        result = (char *)os_gets((uchar *)buf, bufl);
        
        /* 
         *   if the result is null, we're at eof, so return a non-zero
         *   value; otherwise, we successfully read a command, so return
         *   zero 
         */
        retval = (result == 0);
    }

    /* restore the original "more" mode */
    setmore(savemoremode);

    /* check the result */
    if (retval != 0)
    {
        /* we got an error reading the command - return the error */
        return retval;
    }
    else
    {
        char *p;
        
        /* 
         *   we got a command, or at least a partial command (if we timed
         *   out, we may still have a partial line in the buffer) - write
         *   the input line to the log and/or command files, as
         *   appropriate 
         */
        out_logfile_print(buf, TRUE);
        if (cmdfile != 0)
        {
            os_fprintz(cmdfile, ">");
            os_fprintz(cmdfile, buf);
            os_fprintz(cmdfile, "\n");
        }

        /* translate the input to the internal character set */
        for (p = buf ; *p != '\0' ; ++p)
            *p = cmap_n2i(*p);

        /* success */
        return retval;
    }
}